

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLElement * __thiscall tinyxml2::XMLNode::ToElementWithName(XMLNode *this,char *name)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *__s1;
  XMLElement *pXVar2;
  
  iVar1 = (*this->_vptr_XMLNode[6])();
  pXVar2 = (XMLElement *)CONCAT44(extraout_var,iVar1);
  if (pXVar2 != (XMLElement *)0x0) {
    if (name == (char *)0x0) {
      return pXVar2;
    }
    iVar1 = (*(pXVar2->super_XMLNode)._vptr_XMLNode[9])();
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      __s1 = StrPair::GetStr(&(pXVar2->super_XMLNode)._value);
    }
    else {
      __s1 = (char *)0x0;
    }
    if (__s1 == name) {
      return pXVar2;
    }
    iVar1 = strncmp(__s1,name,0x7fffffff);
    if (iVar1 == 0) {
      return pXVar2;
    }
  }
  return (XMLElement *)0x0;
}

Assistant:

const XMLElement* XMLNode::ToElementWithName( const char* name ) const
{
    const XMLElement* element = this->ToElement();
    if ( element == 0 ) {
        return 0;
    }
    if ( name == 0 ) {
        return element;
    }
    if ( XMLUtil::StringEqual( element->Name(), name ) ) {
       return element;
    }
    return 0;
}